

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O1

void * metacall_value_cast_future(void **v)

{
  type_id tVar1;
  value pvVar2;
  future pfVar3;
  undefined8 unaff_RBX;
  type_id id;
  value unaff_retaddr;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar1 = value_type_id(*v);
  if (tVar1 != 0xc) {
    pvVar2 = value_type_cast(unaff_retaddr,id);
    if (pvVar2 != (value)0x0) {
      *v = pvVar2;
    }
  }
  pfVar3 = value_to_future(*v);
  return pfVar3;
}

Assistant:

void *metacall_value_cast_future(void **v)
{
	if (value_type_id(*v) != TYPE_FUTURE)
	{
		value v_cast = value_type_cast(*v, TYPE_FUTURE);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_future(*v);
}